

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::iterate(GridRenderCase *this)

{
  pointer pSVar1;
  ostringstream *this_00;
  uint uVar2;
  RenderContext *pRVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_01;
  ObjectWrapper *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TestLog *pTVar9;
  TestError *this_02;
  runtime_error *this_03;
  int iVar10;
  ConstPixelBufferAccess *pCVar11;
  LogImageSet *this_04;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  bool bVar12;
  qpTestResult testResult;
  int iVar13;
  void *pvVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  ulong uVar18;
  Surface errorMask;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> renderedLayers;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  VertexArray vao;
  Framebuffer readFbo;
  Framebuffer clearFbo;
  string local_460;
  string local_440;
  Surface local_420;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  string local_3e0;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  string local_398;
  string local_378;
  string local_358;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> local_338;
  LogImageSet local_320;
  TextureFormat local_2e0;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
            (&local_338,(long)this->m_numLayers,(allocator_type *)local_1b0);
  if (0 < this->m_numLayers) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      tcu::Surface::setSize
                ((Surface *)
                 ((long)&(local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_width + lVar15),0x100,0x100);
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x18;
    } while (lVar17 < this->m_numLayers);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
             ,0x86);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar5);
  iVar5 = (**(code **)(lVar15 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_2d8,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar8);
  local_320.m_name._M_dataplus._M_p = (pointer)0x0;
  if (iVar5 == -1) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = (long)local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Attribute a_position location was -1","");
    tcu::TestError::TestError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar15 + 0x1a00))
            (0,0,(local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_width,
             (local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
              super__Vector_impl_data._M_start)->m_height);
  (**(code **)(lVar15 + 0x1c0))(0,0,0,0x3f800000);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x98b);
  (**(code **)(lVar15 + 0xd8))(local_2d8.m_name.field_2._M_allocated_capacity._0_4_);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x98e);
  (**(code **)(lVar15 + 0x1680))((this->m_program->m_program).m_program);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x991);
  (**(code **)(lVar15 + 0xfd8))(0x8e72,1);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x994);
  (**(code **)(lVar15 + 0x1858))(0,0,0,0x3f800000,iVar5);
  if ((this->m_flags & 0x200) == 0) {
    (**(code **)(lVar15 + 0x188))(0x4000);
  }
  else {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)local_1b0,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar8);
    (**(code **)(lVar15 + 0x78))(0x8d40,local_1b0._16_4_);
    if (0 < this->m_numLayers) {
      iVar5 = 0;
      do {
        (**(code **)(lVar15 + 0x6b8))(0x8d40,0x8ce0,this->m_texture,0,iVar5);
        (**(code **)(lVar15 + 0x188))(0x4000);
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_numLayers);
    }
    dVar7 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar7,"clear tex contents",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9a5);
    glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1b0);
    this_01 = (ObjectWrapper *)operator_new(0x18);
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(this_01,(Functions *)CONCAT44(extraout_var_02,iVar5),pOVar8);
    local_1b0._0_4_ = R;
    local_1b0._4_4_ = SNORM_INT8;
    if ((ObjectWrapper *)local_320.m_name._M_dataplus._M_p != this_01) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)&local_320);
      local_320.m_name._M_dataplus._M_p = (pointer)this_01;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)local_1b0);
    (**(code **)(lVar15 + 0x78))(0x8d40,*(deUint32 *)(local_320.m_name._M_dataplus._M_p + 0x10));
    (**(code **)(lVar15 + 0x690))(0x8d40,0x8ce0,this->m_texture,0);
    dVar7 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar7,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9ae);
  }
  (**(code **)(lVar15 + 0x538))(0xe,0,1);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  if ((dVar7 == 0x505) && ((this->m_flags & 0x400) != 0)) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,"got GL_OUT_OF_MEMORY while drawing");
    *(undefined ***)this_03 = &PTR__runtime_error_00b36798;
    __cxa_throw(this_03,&(anonymous_namespace)::AllowedRenderFailureException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  glu::checkError(dVar7,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x9c0);
  if ((this->m_flags & 0x200) == 0) {
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
    pvVar14 = (void *)((local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                        _M_impl.super__Vector_impl_data._M_start)->m_pixels).m_cap;
    if (pvVar14 != (void *)0x0) {
      pvVar14 = ((local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_240,
               (local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                super__Vector_impl_data._M_start)->m_width,
               (local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                super__Vector_impl_data._M_start)->m_height,1,pvVar14);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
    dVar7 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9d4);
  }
  else {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)&local_240,(Functions *)CONCAT44(extraout_var_03,iVar5),pOVar8);
    (**(code **)(lVar15 + 0x78))(0x8d40);
    if (0 < this->m_numLayers) {
      lVar17 = 0x10;
      uVar18 = 0;
      do {
        (**(code **)(lVar15 + 0x6b8))(0x8d40,0x8ce0,this->m_texture,0,uVar18 & 0xffffffff);
        pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
        local_408._0_4_ = RGBA;
        local_408._4_4_ = UNORM_INT8;
        pvVar14 = *(void **)((long)&(local_338.
                                     super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_width + lVar17);
        if (pvVar14 != (void *)0x0) {
          pvVar14 = *(void **)((long)local_338.
                                     super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_408,
                   *(int *)((long)local_338.
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17 + -0x10),
                   *(int *)((long)local_338.
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17 + -0xc),1,
                   pvVar14);
        glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
        dVar7 = (**(code **)(lVar15 + 0x800))();
        glu::checkError(dVar7,"read pixels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                        ,0x9ce);
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x18;
      } while ((long)uVar18 < (long)this->m_numLayers);
    }
    glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_240);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           *)&local_320);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_2d8);
  if (this->m_numLayers < 1) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    bVar16 = 1;
    lVar15 = 0;
    do {
      pSVar1 = local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
               super__Vector_impl_data._M_start;
      tcu::Surface::Surface
                (&local_420,
                 local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15].m_width,
                 local_338.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15].m_height);
      local_2d8.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar14 = (void *)local_420.m_pixels.m_cap;
      if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
        pvVar14 = local_420.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d8,local_420.m_width,
                 local_420.m_height,1,pvVar14);
      local_2d8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
      local_2d8.m_name._M_string_length = 0x3f80000000000000;
      tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d8);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Verifying output layer ",0x17);
      std::ostream::operator<<(local_1b0 + 8,(int)lVar15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pSVar1 = pSVar1 + lVar15;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      iVar5 = pSVar1->m_height;
      if (iVar5 < 1) {
LAB_0056dc7b:
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image valid.",0xc);
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_408._0_8_ = &local_3f8;
        local_2d8.m_name._M_dataplus._M_p = (pointer)0x11;
        local_408._0_8_ = std::__cxx11::string::_M_create((ulong *)local_408,(ulong)&local_2d8);
        local_3f8._M_allocated_capacity = (size_type)local_2d8.m_name._M_dataplus._M_p;
        *(undefined8 *)local_408._0_8_ = 0x7265566567616d49;
        builtin_strncpy((char *)(local_408._0_8_ + 8),"ificatio",8);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_408._0_8_ + 0x10))->_M_local_buf[0] = 'n';
        local_408._8_8_ = local_2d8.m_name._M_dataplus._M_p;
        local_2d8.m_name._M_dataplus._M_p[local_408._0_8_] = '\0';
        local_3c0._0_8_ = &local_3b0;
        local_2d8.m_name._M_dataplus._M_p = (pointer)0x12;
        local_3c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3c0,(ulong)&local_2d8);
        local_3b0._M_allocated_capacity = (size_type)local_2d8.m_name._M_dataplus._M_p;
        *(undefined8 *)local_3c0._0_8_ = 0x6576206567616d49;
        builtin_strncpy((char *)(local_3c0._0_8_ + 8),"rificati",8);
        *(undefined2 *)(local_3c0._0_8_ + 0x10) = 0x6e6f;
        local_3c0._8_8_ = local_2d8.m_name._M_dataplus._M_p;
        local_2d8.m_name._M_dataplus._M_p[local_3c0._0_8_] = '\0';
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_240,(string *)local_408,(string *)local_3c0);
        tcu::TestLog::startImageSet
                  (pTVar9,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p
                  );
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        local_460._M_string_length = 6;
        local_460.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_440.field_2._8_7_ = 0x746c7573657220;
        local_440.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
        local_440.field_2._M_local_buf[7] = 'd';
        local_440._M_string_length = 0xf;
        local_440.field_2._M_local_buf[0xf] = '\0';
        local_3e0._M_dataplus._M_p = (pointer)0x300000008;
        pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
        this_04 = &local_320;
        if (pvVar14 != (void *)0x0) {
          pvVar14 = (pSVar1->m_pixels).m_ptr;
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)this_04,(TextureFormat *)&local_3e0,pSVar1->m_width,
                   pSVar1->m_height,1,pvVar14);
        tcu::LogImage::LogImage
                  (&local_2d8,&local_460,&local_440,(ConstPixelBufferAccess *)this_04,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,(int)pTVar9,__buf_01,(size_t)this_04);
        tcu::TestLog::endImageSet(pTVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
          operator_delete(local_2d8.m_description._M_dataplus._M_p,
                          local_2d8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
          operator_delete(local_2d8.m_name._M_dataplus._M_p,
                          CONCAT44(local_2d8.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_2d8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT17(local_440.field_2._M_local_buf[7],
                                   local_440.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,
                          (ulong)(local_460.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          CONCAT44(local_240.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_240.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._0_8_ != &local_3b0) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3b0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._0_8_ != &local_3f8) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        bVar4 = 1;
      }
      else {
        pvVar14 = (pSVar1->m_pixels).m_ptr;
        iVar6 = pSVar1->m_width;
        bVar12 = false;
        iVar10 = 0;
        iVar13 = iVar6;
        do {
          if (0 < iVar13) {
            iVar5 = 0;
            do {
              uVar2 = *(uint *)((long)pvVar14 + (long)(iVar13 * iVar10 + iVar5) * 4);
              if ((uVar2 & 0xff00) < 0xf700 || 0x80000 < (uVar2 & 0xff0000)) {
                *(undefined4 *)
                 ((long)local_420.m_pixels.m_ptr + (long)(local_420.m_width * iVar10 + iVar5) * 4) =
                     0xff0000ff;
                iVar6 = pSVar1->m_width;
                bVar12 = true;
              }
              iVar5 = iVar5 + 1;
              iVar13 = iVar6;
            } while (iVar5 < iVar6);
            iVar5 = pSVar1->m_height;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar5);
        if (!bVar12) goto LAB_0056dc7b;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image verification failed, found invalid pixels.",
                   0x30);
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        local_2d8.m_name._M_dataplus._M_p = (pointer)0x11;
        local_460._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)&local_2d8);
        local_460.field_2._M_allocated_capacity = (size_type)local_2d8.m_name._M_dataplus._M_p;
        *(undefined8 *)local_460._M_dataplus._M_p = 0x7265566567616d49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 8) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 9) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 0xc) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 0xe) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p + 0xf) = 'o';
        local_460._M_dataplus._M_p[0x10] = 'n';
        local_460._M_string_length = (size_type)local_2d8.m_name._M_dataplus._M_p;
        local_460._M_dataplus._M_p[(long)local_2d8.m_name._M_dataplus._M_p] = '\0';
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_2d8.m_name._M_dataplus._M_p = (pointer)0x12;
        local_440._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)&local_2d8);
        local_440.field_2._M_allocated_capacity._0_7_ = SUB87(local_2d8.m_name._M_dataplus._M_p,0);
        local_440.field_2._M_local_buf[7] = (char)((ulong)local_2d8.m_name._M_dataplus._M_p >> 0x38)
        ;
        *(undefined8 *)local_440._M_dataplus._M_p = 0x6576206567616d49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 8) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 9) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xc) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xf) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0x11) = 'n';
        local_440._M_string_length = (size_type)local_2d8.m_name._M_dataplus._M_p;
        local_440._M_dataplus._M_p[(long)local_2d8.m_name._M_dataplus._M_p] = '\0';
        tcu::LogImageSet::LogImageSet(&local_320,&local_460,&local_440);
        tcu::TestLog::startImageSet
                  (pTVar9,local_320.m_name._M_dataplus._M_p,local_320.m_description._M_dataplus._M_p
                  );
        local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
        local_3e0.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_3e0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_3e0._M_string_length = 6;
        local_3e0.field_2._M_local_buf[6] = '\0';
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        local_358.field_2._8_7_ = 0x746c7573657220;
        local_358.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
        local_358.field_2._M_local_buf[7] = 'd';
        local_358._M_string_length = 0xf;
        local_358.field_2._M_local_buf[0xf] = '\0';
        local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
        pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
        if (pvVar14 != (void *)0x0) {
          pvVar14 = (pSVar1->m_pixels).m_ptr;
        }
        pCVar11 = (ConstPixelBufferAccess *)local_408;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (pCVar11,(TextureFormat *)&local_240,pSVar1->m_width,pSVar1->m_height,1,pvVar14);
        tcu::LogImage::LogImage
                  (&local_2d8,&local_3e0,&local_358,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,(int)pTVar9,__buf,(size_t)pCVar11);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        local_378.field_2._M_allocated_capacity = 0x73614d726f727245;
        local_378.field_2._M_local_buf[8] = 'k';
        local_378._M_string_length = 9;
        local_378.field_2._M_local_buf[9] = '\0';
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        local_398.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_398.field_2._8_2_ = 0x6b73;
        local_398._M_string_length = 10;
        local_398.field_2._M_local_buf[10] = '\0';
        local_2e0.order = RGBA;
        local_2e0.type = UNORM_INT8;
        pvVar14 = (void *)local_420.m_pixels.m_cap;
        if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_420.m_pixels.m_ptr;
        }
        pCVar11 = (ConstPixelBufferAccess *)local_3c0;
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)pCVar11,&local_2e0,local_420.m_width,local_420.m_height,1,
                   pvVar14);
        tcu::LogImage::LogImage
                  (&local_240,&local_378,&local_398,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,(int)pTVar9,__buf_00,(size_t)pCVar11);
        tcu::TestLog::endImageSet(pTVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          CONCAT44(local_240.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_240.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
          operator_delete(local_2d8.m_description._M_dataplus._M_p,
                          local_2d8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
          operator_delete(local_2d8.m_name._M_dataplus._M_p,
                          CONCAT44(local_2d8.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_2d8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,
                          CONCAT17(local_358.field_2._M_local_buf[7],
                                   local_358.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          operator_delete(local_3e0._M_dataplus._M_p,
                          CONCAT17(local_3e0.field_2._M_local_buf[7],
                                   CONCAT16(local_3e0.field_2._M_local_buf[6],
                                            CONCAT24(local_3e0.field_2._M_allocated_capacity._4_2_,
                                                     local_3e0.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.m_description._M_dataplus._M_p != &local_320.m_description.field_2) {
          operator_delete(local_320.m_description._M_dataplus._M_p,
                          local_320.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.m_name._M_dataplus._M_p != &local_320.m_name.field_2) {
          operator_delete(local_320.m_name._M_dataplus._M_p,
                          local_320.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT17(local_440.field_2._M_local_buf[7],
                                   local_440.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,
                          (ulong)(local_460.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        bVar4 = 0;
      }
      bVar16 = bVar16 & bVar4;
      tcu::Surface::~Surface(&local_420);
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->m_numLayers);
    testResult = (qpTestResult)(bVar16 ^ 1);
    description = "Image verification failed";
    if (bVar16 != 0) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector(&local_338);
  return STOP;
}

Assistant:

GridRenderCase::IterateResult GridRenderCase::iterate (void)
{
	std::vector<tcu::Surface>	renderedLayers	(m_numLayers);
	bool						allLayersOk		= true;

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		renderedLayers[ndx].setSize(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)." << tcu::TestLog::EndMessage;

	try
	{
		renderTo(renderedLayers);
	}
	catch (const AllowedRenderFailureException& ex)
	{
		// Got accepted failure
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Could not render, reason: " << ex.what() << "\n"
			<< "Failure is allowed."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		allLayersOk &= verifyResultLayer(ndx, renderedLayers[ndx]);

	if (allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	return STOP;
}